

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_dec
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  uint uVar1;
  anon_class_16_2_cb75083a_for_f f;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  uint uVar3;
  int num_digits;
  string_view prefix;
  undefined4 uStack_c;
  
  uVar3 = this->abs_value | 1;
  uVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  num_digits = (uint)*(ushort *)(bsr2log10(int)::data + (ulong)uVar1 * 2) -
               (uint)(this->abs_value <
                     *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                              (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)uVar1 * 2) * 4));
  f._12_4_ = uStack_c;
  f.num_digits = num_digits;
  f.this = this;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  bVar2 = write_int<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned_int>::on_dec()::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_>
                    ((this->out).container,num_digits,prefix,this->specs,f);
  (this->out).container = bVar2.container;
  return;
}

Assistant:

void on_dec() {
    auto num_digits = count_digits(abs_value);
    out = write_int(
        out, num_digits, get_prefix(), specs, [this, num_digits](iterator it) {
          return format_decimal<Char>(it, abs_value, num_digits).end;
        });
  }